

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O1

Iterator * __thiscall
leveldb::TableCache::NewIterator
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,
          Table **tableptr)

{
  Table *this_00;
  _Alloc_hider arg2;
  int iVar1;
  Iterator *this_01;
  undefined4 extraout_var;
  Status s;
  Handle *handle;
  Status local_38;
  _Alloc_hider local_30;
  
  if (tableptr != (Table **)0x0) {
    *tableptr = (Table *)0x0;
  }
  local_30._M_p = (pointer)0x0;
  FindTable((TableCache *)&local_38,(uint64_t)this,file_number,(Handle **)file_size);
  arg2._M_p = local_30._M_p;
  if ((Env *)local_38.state_ == (Env *)0x0) {
    iVar1 = (*this->cache_->_vptr_Cache[5])(this->cache_,local_30._M_p);
    this_00 = *(Table **)(CONCAT44(extraout_var,iVar1) + 8);
    this_01 = Table::NewIterator(this_00,options);
    Iterator::RegisterCleanup(this_01,UnrefEntry,this->cache_,arg2._M_p);
    if (tableptr != (Table **)0x0) {
      *tableptr = this_00;
    }
  }
  else {
    this_01 = NewErrorIterator(&local_38);
  }
  if ((Env *)local_38.state_ != (Env *)0x0) {
    operator_delete__(local_38.state_);
  }
  return this_01;
}

Assistant:

Iterator* TableCache::NewIterator(const ReadOptions& options,
                                  uint64_t file_number, uint64_t file_size,
                                  Table** tableptr) {
  if (tableptr != nullptr) {
    *tableptr = nullptr;
  }

  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (!s.ok()) {
    return NewErrorIterator(s);
  }

  Table* table = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
  Iterator* result = table->NewIterator(options);
  result->RegisterCleanup(&UnrefEntry, cache_, handle);
  if (tableptr != nullptr) {
    *tableptr = table;
  }
  return result;
}